

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O3

bool __thiscall
iDynTree::BerdyHelper::serializeDynamicVariablesComputedFromFixedBaseRNEA
          (BerdyHelper *this,JointDOFsDoubleArray *jointAccs,LinkNetExternalWrenches *netExtWrenches
          ,VectorDynSize *d)

{
  bool bVar1;
  long lVar2;
  Twist *pTVar3;
  SpatialMomentum *pSVar4;
  Wrench *this_00;
  JointDOFsDoubleArray *jointTorques;
  long lVar5;
  LinkAccArray linkProperAccs;
  LinkNetTotalWrenchesWithoutGravity linkNetWrenchesWithoutGravity;
  LinkVelArray linkVels;
  LinkInternalWrenches intWrenches;
  Wrench local_1b0;
  SpatialInertia local_178 [56];
  Twist local_140 [56];
  Vector3 zeroVec;
  Vector3 baseProperAcc;
  FreeFloatingGeneralizedTorques genTrqs;
  SpatialForceVector local_68 [56];
  
  iDynTree::LinkWrenches::LinkWrenches(&intWrenches,&this->m_model);
  iDynTree::FreeFloatingGeneralizedTorques::FreeFloatingGeneralizedTorques(&genTrqs,&this->m_model);
  iDynTree::LinkVelArray::LinkVelArray(&linkVels,&this->m_model);
  iDynTree::LinkAccArray::LinkAccArray(&linkProperAccs,&this->m_model);
  baseProperAcc.m_data[0]._0_4_ = *(undefined4 *)(this->m_gravity).m_data;
  baseProperAcc.m_data[1]._0_4_ = *(undefined4 *)((this->m_gravity).m_data + 1);
  baseProperAcc.m_data[0]._4_4_ = *(uint *)((long)(this->m_gravity).m_data + 4) ^ 0x80000000;
  baseProperAcc.m_data[1]._4_4_ = *(uint *)((long)(this->m_gravity).m_data + 0xc) ^ 0x80000000;
  baseProperAcc.m_data[2] = -(this->m_gravity).m_data[2];
  zeroVec.m_data[0] = 0.0;
  zeroVec.m_data[1] = 0.0;
  zeroVec.m_data[2] = 0.0;
  dynamicsEstimationForwardVelAccKinematics
            (&this->m_model,&this->m_dynamicsTraversal,&baseProperAcc,&zeroVec,&zeroVec,
             &this->m_jointPos,&this->m_jointVel,jointAccs,&linkVels,&linkProperAccs);
  iDynTree::RNEADynamicPhase
            (&this->m_model,&this->m_dynamicsTraversal,&this->m_jointPos,&linkVels,&linkProperAccs,
             netExtWrenches,&intWrenches,&genTrqs);
  iDynTree::LinkWrenches::LinkWrenches(&linkNetWrenchesWithoutGravity,&this->m_model);
  lVar5 = 0;
  while( true ) {
    lVar2 = iDynTree::Model::getNrOfLinks();
    if (lVar2 <= lVar5) break;
    iDynTree::Model::getLink((long)this);
    pTVar3 = (Twist *)iDynTree::Link::getInertia();
    iDynTree::LinkAccArray::operator()(&linkProperAccs,lVar5);
    pSVar4 = (SpatialMomentum *)iDynTree::LinkVelArray::operator()(&linkVels,lVar5);
    iDynTree::SpatialInertia::operator*((SpatialInertia *)&local_1b0,(SpatialAcc *)pTVar3);
    iDynTree::SpatialInertia::operator*(local_178,pTVar3);
    iDynTree::Twist::operator*(local_140,pSVar4);
    iDynTree::Wrench::operator+((Wrench *)local_68,&local_1b0);
    this_00 = (Wrench *)iDynTree::LinkWrenches::operator()(&linkNetWrenchesWithoutGravity,lVar5);
    iDynTree::Wrench::operator=(this_00,(Wrench *)local_68);
    iDynTree::SpatialForceVector::~SpatialForceVector(local_68);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_140);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_178);
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_1b0.super_SpatialForceVector);
    lVar5 = lVar5 + 1;
  }
  jointTorques = (JointDOFsDoubleArray *)iDynTree::FreeFloatingGeneralizedTorques::jointTorques();
  bVar1 = serializeDynamicVariables
                    (this,&linkProperAccs,&linkNetWrenchesWithoutGravity,netExtWrenches,&intWrenches
                     ,jointTorques,jointAccs,d);
  iDynTree::LinkWrenches::~LinkWrenches(&linkNetWrenchesWithoutGravity);
  iDynTree::LinkAccArray::~LinkAccArray(&linkProperAccs);
  iDynTree::LinkVelArray::~LinkVelArray(&linkVels);
  iDynTree::FreeFloatingGeneralizedTorques::~FreeFloatingGeneralizedTorques(&genTrqs);
  iDynTree::LinkWrenches::~LinkWrenches(&intWrenches);
  return bVar1;
}

Assistant:

bool BerdyHelper::serializeDynamicVariablesComputedFromFixedBaseRNEA(JointDOFsDoubleArray& jointAccs,
                                                                     LinkNetExternalWrenches& netExtWrenches,
                                                                     VectorDynSize& d)
{
    assert(jointAccs.size() == this->m_model.getNrOfDOFs());
    assert(netExtWrenches.isConsistent(this->m_model));

    LinkInternalWrenches intWrenches(this->m_model);
    FreeFloatingGeneralizedTorques genTrqs(this->m_model);

    LinkVelArray linkVels(this->m_model);
    LinkAccArray linkProperAccs(this->m_model);


    Vector3 baseProperAcc;
    toEigen(baseProperAcc) = -toEigen(m_gravity);
    Vector3 zeroVec;
    zeroVec.zero();
    dynamicsEstimationForwardVelAccKinematics(m_model,m_dynamicsTraversal,
                                                        baseProperAcc,
                                                        zeroVec,
                                                        zeroVec,
                                                        m_jointPos,
                                                        m_jointVel,
                                                        jointAccs,
                                                        linkVels,
                                                        linkProperAccs);

    RNEADynamicPhase(m_model,m_dynamicsTraversal,
                     m_jointPos,linkVels,linkProperAccs,
                     netExtWrenches,intWrenches,genTrqs);

    // Generate the d vector of dynamical variables
    assert(d.size() == this->getNrOfDynamicVariables());

    // LinkNewInternalWrenches (necessary for the old-style berdy)
    LinkNetTotalWrenchesWithoutGravity linkNetWrenchesWithoutGravity(this->model());

    for(LinkIndex visitedLinkIndex = 0; visitedLinkIndex < static_cast<LinkIndex>(model().getNrOfLinks()); visitedLinkIndex++)
     {
         LinkConstPtr visitedLink = this->model().getLink(visitedLinkIndex);

         const iDynTree::SpatialInertia & I = visitedLink->getInertia();
         const iDynTree::SpatialAcc     & properAcc = linkProperAccs(visitedLinkIndex);
         const iDynTree::Twist          & v = linkVels(visitedLinkIndex);
         linkNetWrenchesWithoutGravity(visitedLinkIndex) = I*properAcc + v*(I*v);
     }

     return serializeDynamicVariables(linkProperAccs,linkNetWrenchesWithoutGravity,netExtWrenches,
                                      intWrenches,genTrqs.jointTorques(),jointAccs,d);
}